

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::OpenSSLClient::OpenSSLClient
          (OpenSSLClient *this,string *host,int port,milliseconds read_timeout)

{
  SSL_CTX *pSVar1;
  allocator<char> local_59;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__OpenSSLClient_00209eb8;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  OutputStreamImpl::OutputStreamImpl(&this->output_stream_,this);
  InputStreamImpl::InputStreamImpl(&this->input_stream_,this);
  if (Log == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"OpenSSLClient",&local_59);
    LoggerFactory::GetLogger((LoggerFactory *)&local_58,&local_48);
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&Log,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__cxx11::string::~string((string *)&local_48);
  }
  OPENSSL_init_ssl(0,0);
  std::__cxx11::string::operator=((string *)&this->host_,(string *)host);
  this->port_ = port;
  (this->read_timeout_).__r = read_timeout.__r;
  pSVar1 = InitCTX(this);
  this->ctx_ = pSVar1;
  return;
}

Assistant:

OpenSSLClient::OpenSSLClient(std::string host, int port, std::chrono::milliseconds read_timeout) : output_stream_(OutputStreamImpl(*this)), input_stream_(InputStreamImpl(*this))
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("OpenSSLClient");
    }
    SSL_library_init();
    host_ = std::move(host);
    port_ = port;
    read_timeout_ = read_timeout;
    ctx_ = InitCTX();
}